

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O2

void __thiscall UDMFParser::ParseThing(UDMFParser *this,FMapThing *th)

{
  int *piVar1;
  uint uVar2;
  double dVar3;
  ushort uVar4;
  bool bVar5;
  int iVar6;
  DWORD DVar7;
  FName FVar8;
  char *pcVar9;
  long lVar10;
  FDoomEdEntry *pFVar11;
  FString *this_00;
  ulong uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  FString arg1str;
  FString arg0str;
  FName key;
  FName style;
  int local_a0;
  int local_9c [2];
  int aiStack_94 [2];
  int local_8c;
  
  arg0str.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  arg1str.Chars = FString::NullString.Nothing;
  memset(th,0,0x90);
  th->RenderStyle = 0xe;
  th->FloatbobPhase = -1;
  th->Gravity = 1.0;
  th->Alpha = -1.0;
  th->health = 1;
  FScanner::MustGetToken((FScanner *)this,0x7b);
  piVar1 = &th->special;
switchD_0045cb11_caseD_1:
  bVar5 = FScanner::CheckToken((FScanner *)this,0x7d);
  if (bVar5) {
    if ((*(int *)(arg0str.Chars + -0xc) != 0) &&
       (((iVar6 = *piVar1, iVar6 - 0x50U < 6 || (iVar6 == 0xe2)) || (iVar6 == 0)))) {
      FName::FName(&style,&arg0str);
      th->args[0] = -style.Index;
    }
    if (*(int *)(arg1str.Chars + -0xc) != 0) {
      uVar2 = *piVar1 - 0x86;
      if (((uVar2 < 0x2d) && ((0x12000000002fU >> ((ulong)uVar2 & 0x3f) & 1) != 0)) ||
         (*piVar1 == 0)) {
        FName::FName(&style,&arg1str);
        th->args[1] = -style.Index;
      }
    }
    if ((this->super_UDMFParserBase).namespc.Index == 0x18d) {
      if (*piVar1 != 0) {
        P_TranslateLineDef((line_t *)&style,(maplinedef_t *)&key,-1);
        *piVar1 = local_a0;
        th->args[4] = local_8c;
        *(int (*) [2])th->args = local_9c;
        *(int (*) [2])(th->args + 2) = aiStack_94;
      }
    }
    else if (this->isTranslated == true) {
      th->special = 0;
      th->args[0] = 0;
      th->args[1] = 0;
      th->args[2] = 0;
      th->args[3] = 0;
      th->args[4] = 0;
    }
    FString::~FString(&arg1str);
    FString::~FString(&arg0str);
    return;
  }
  UDMFParserBase::ParseKey((UDMFParserBase *)&key,SUB81(this,0),(bool *)0x0);
  FVar8 = key;
  uVar12 = (ulong)(uint)key.Index;
  switch(key.Index) {
  case 0xe6:
    dVar3 = UDMFParserBase::CheckFloat
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0xe6].Text);
    th->Alpha = dVar3;
    goto switchD_0045cb11_caseD_1;
  case 0xe7:
    iVar6 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0xe7].Text);
    th->angle = (short)iVar6;
    goto switchD_0045cb11_caseD_1;
  case 0xe8:
  case 0xe9:
  case 0xea:
  case 0xee:
  case 0xef:
  case 0xf0:
  case 0xf3:
  case 0xf4:
  case 0xf5:
  case 0xf6:
  case 0xf7:
  case 0xf8:
  case 0xf9:
  case 0xfa:
  case 0xfb:
  case 0xfc:
  case 0xfd:
  case 0xfe:
  case 0xff:
  case 0x100:
  case 0x101:
  case 0x102:
  case 0x103:
  case 0x104:
  case 0x105:
  case 0x106:
  case 0x107:
  case 0x108:
  case 0x109:
  case 0x10a:
  case 0x10b:
  case 0x10c:
  case 0x10d:
  case 0x10e:
  case 0x10f:
  case 0x110:
  case 0x111:
  case 0x112:
  case 0x113:
  case 0x114:
  case 0x115:
  case 0x120:
  case 0x121:
  case 0x122:
  case 0x123:
  case 0x124:
  case 0x125:
  case 0x126:
  case 0x127:
  case 0x128:
  case 0x129:
  case 0x12a:
  case 299:
  case 300:
  case 0x12d:
  case 0x12e:
  case 0x12f:
  case 0x130:
  case 0x141:
  case 0x142:
  case 0x145:
  case 0x165:
  case 0x166:
  case 0x167:
  case 0x168:
  case 0x169:
  case 0x16a:
  case 0x16b:
  case 0x16c:
  case 0x16d:
  case 0x16e:
  case 0x16f:
  case 0x170:
  case 0x171:
  case 0x172:
  case 0x173:
  case 0x174:
  case 0x175:
  case 0x176:
  case 0x177:
  case 0x178:
  case 0x179:
  case 0x17a:
  case 0x17b:
  case 0x17c:
  case 0x17d:
  case 0x17e:
switchD_0045c9d0_caseD_e8:
    if (((this->super_UDMFParserBase).namespace_bits & 0x30) != 0) {
      pcVar9 = FName::NameData.NameArray[key.Index].Text;
      iVar6 = strncasecmp("user_",pcVar9,5);
      if (iVar6 == 0) {
        style = FVar8;
        UDMFParserBase::CheckInt(&this->super_UDMFParserBase,pcVar9);
        TArray<FMapThingUserData,_FMapThingUserData>::Push
                  (&MapThingsUserData,(FMapThingUserData *)&style);
      }
    }
    goto switchD_0045cb11_caseD_1;
  case 0xeb:
    iVar6 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0xeb].Text);
    th->health = iVar6;
    goto switchD_0045cb11_caseD_1;
  case 0xec:
    iVar6 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0xec].Text);
    th->pitch = (short)iVar6;
    goto switchD_0045cb11_caseD_1;
  case 0xed:
    if (((this->super_UDMFParserBase).namespace_bits & 0x74) != 0) {
      iVar6 = UDMFParserBase::CheckInt
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0xed].Text);
      *piVar1 = iVar6;
    }
    goto switchD_0045cb11_caseD_1;
  case 0xf1:
    dVar3 = UDMFParserBase::CheckFloat
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0xf1].Text);
    (th->pos).X = dVar3;
    goto switchD_0045cb11_caseD_1;
  case 0xf2:
    dVar3 = UDMFParserBase::CheckFloat
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0xf2].Text);
    (th->pos).Y = dVar3;
    goto switchD_0045cb11_caseD_1;
  case 0x116:
    dVar3 = UDMFParserBase::CheckFloat
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x116].Text);
    (th->pos).Z = dVar3;
    goto switchD_0045cb11_caseD_1;
  case 0x117:
    iVar6 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x117].Text);
    th->EdNum = (short)iVar6;
    pFVar11 = TMap<int,_FDoomEdEntry,_THashTraits<int>,_TValueTraits<FDoomEdEntry>_>::CheckKey
                        (&DoomEdMap,(int)(short)iVar6);
    th->info = pFVar11;
    goto switchD_0045cb11_caseD_1;
  case 0x118:
  case 0x119:
  case 0x11a:
  case 0x11b:
  case 0x11c:
    if (((this->super_UDMFParserBase).namespace_bits & 0x74) != 0) {
      iVar6 = UDMFParserBase::CheckInt
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[uVar12].Text);
      *(int *)((long)th + (long)key.Index * 4 + -0x428) = iVar6;
    }
    goto switchD_0045cb11_caseD_1;
  case 0x11d:
    if (((this->super_UDMFParserBase).namespace_bits & 0x10) != 0) {
      pcVar9 = UDMFParserBase::CheckString
                         (&this->super_UDMFParserBase,FName::NameData.NameArray[0x11d].Text);
      this_00 = &arg0str;
      goto LAB_0045ce04;
    }
    goto switchD_0045cb11_caseD_1;
  case 0x11e:
    if (((this->super_UDMFParserBase).namespace_bits & 0x10) != 0) {
      pcVar9 = UDMFParserBase::CheckString
                         (&this->super_UDMFParserBase,FName::NameData.NameArray[0x11e].Text);
      this_00 = &arg1str;
LAB_0045ce04:
      FString::operator=(this_00,pcVar9);
    }
    goto switchD_0045cb11_caseD_1;
  case 0x11f:
    iVar6 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x11f].Text);
    th->thingid = iVar6;
    goto switchD_0045cb11_caseD_1;
  case 0x131:
  case 0x132:
  case 0x133:
  case 0x134:
  case 0x135:
  case 0x136:
  case 0x137:
  case 0x138:
  case 0x139:
  case 0x13a:
  case 0x13b:
  case 0x13c:
  case 0x13d:
  case 0x13e:
  case 0x13f:
  case 0x140:
    bVar5 = UDMFParserBase::CheckBool
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[uVar12].Text);
    uVar4 = (ushort)(1 << ((char)key.Index - 0x31U & 0x1f));
    if (bVar5) {
      th->SkillFilter = th->SkillFilter | uVar4;
    }
    else {
      th->SkillFilter = th->SkillFilter & ~uVar4;
    }
    goto switchD_0045cb11_caseD_1;
  case 0x143:
    lVar10 = 0x1430;
    iVar6 = 8;
    break;
  case 0x144:
    if (((this->super_UDMFParserBase).namespace_bits & 0x74) == 0) goto switchD_0045cb11_caseD_1;
    iVar6 = 0x10;
    lVar10 = 0x1440;
    break;
  case 0x146:
  case 0x147:
  case 0x148:
  case 0x149:
  case 0x14a:
  case 0x14b:
  case 0x14c:
  case 0x14d:
  case 0x14e:
  case 0x14f:
  case 0x150:
  case 0x151:
  case 0x152:
  case 0x153:
  case 0x154:
  case 0x155:
    if (((this->super_UDMFParserBase).namespace_bits & 0x74) != 0) {
      bVar5 = UDMFParserBase::CheckBool
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[uVar12].Text);
      uVar4 = (ushort)(1 << ((char)key.Index + 0xbaU & 0x1f));
      if (bVar5) {
        th->ClassFilter = th->ClassFilter | uVar4;
      }
      else {
        th->ClassFilter = th->ClassFilter & ~uVar4;
      }
    }
    goto switchD_0045cb11_caseD_1;
  case 0x156:
    iVar6 = 0x100;
    lVar10 = 0x1560;
    break;
  case 0x157:
    iVar6 = 0x200;
    lVar10 = 0x1570;
    break;
  case 0x158:
    iVar6 = 0x400;
    lVar10 = 0x1580;
    break;
  case 0x159:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0045cb11_caseD_1;
    iVar6 = 0x800;
    lVar10 = 0x1590;
    break;
  case 0x15a:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0045cb11_caseD_1;
    iVar6 = 0x1000;
    lVar10 = 0x15a0;
    break;
  case 0x15b:
    if (((this->super_UDMFParserBase).namespace_bits & 0x71) == 0) goto switchD_0045cb11_caseD_1;
    iVar6 = 0x2000;
    lVar10 = 0x15b0;
    break;
  case 0x15c:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0045cb11_caseD_1;
    iVar6 = 0x2000;
    lVar10 = 0x15c0;
    break;
  case 0x15d:
    if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0) goto switchD_0045cb11_caseD_1;
    iVar6 = 0x4000;
    lVar10 = 0x15d0;
    break;
  case 0x15e:
    if (((this->super_UDMFParserBase).namespace_bits & 0x70) == 0) goto switchD_0045cb11_caseD_1;
    iVar6 = 0x80000;
    lVar10 = 0x15e0;
    break;
  case 0x15f:
    iVar6 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x15f].Text);
    th->score = iVar6;
    goto switchD_0045cb11_caseD_1;
  case 0x160:
    iVar6 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x160].Text);
    th->roll = (short)iVar6;
    goto switchD_0045cb11_caseD_1;
  case 0x161:
    dVar3 = UDMFParserBase::CheckFloat
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x161].Text);
    uVar13 = SUB84(dVar3,0);
    uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
    (th->Scale).Y = dVar3;
    goto LAB_0045cf9c;
  case 0x162:
    dVar3 = UDMFParserBase::CheckFloat
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x162].Text);
    uVar13 = SUB84(dVar3,0);
    uVar14 = (undefined4)((ulong)dVar3 >> 0x20);
LAB_0045cf9c:
    (th->Scale).X = (double)CONCAT44(uVar14,uVar13);
    goto switchD_0045cb11_caseD_1;
  case 0x163:
    dVar3 = UDMFParserBase::CheckFloat
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x163].Text);
    (th->Scale).Y = dVar3;
    goto switchD_0045cb11_caseD_1;
  case 0x164:
    if (((this->super_UDMFParserBase).namespace_bits & 0x30) != 0) {
      iVar6 = UDMFParserBase::CheckInt
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x164].Text);
      th->FloatbobPhase = iVar6;
    }
    goto switchD_0045cb11_caseD_1;
  case 0x17f:
    if (((this->super_UDMFParserBase).namespace_bits & 0x30) != 0) {
      iVar6 = UDMFParserBase::CheckInt
                        (&this->super_UDMFParserBase,FName::NameData.NameArray[0x17f].Text);
      th->Conversation = iVar6;
    }
    goto switchD_0045cb11_caseD_1;
  default:
    if (key.Index == 0x23) goto LAB_0045cfa7;
    if (key.Index == 0x19d) {
      if (((this->super_UDMFParserBase).namespace_bits & 0x30) != 0) {
        dVar3 = UDMFParserBase::CheckFloat
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x19d].Text);
        th->Gravity = dVar3;
      }
      goto switchD_0045cb11_caseD_1;
    }
    if (key.Index != 0x1cd) goto switchD_0045c9d0_caseD_e8;
    pcVar9 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1cd].Text);
    FName::FName(&style,pcVar9);
    FVar8 = style;
    switch(style.Index) {
    case 0:
      break;
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x14:
    case 0x16:
      goto switchD_0045cb11_caseD_1;
    case 0x13:
    case 0x1c:
      FVar8.Index = 7;
      break;
    case 0x15:
      FVar8.Index = 2;
      break;
    case 0x17:
      FVar8.Index = 5;
      break;
    case 0x18:
      FVar8.Index = 0xc;
      break;
    case 0x19:
      FVar8.Index = 1;
      break;
    case 0x1a:
      FVar8.Index = 3;
      break;
    case 0x1b:
      FVar8.Index = 4;
      break;
    case 0x1d:
      FVar8.Index = 8;
      break;
    case 0x1e:
      FVar8.Index = 0xd;
      break;
    case 0x1f:
      FVar8.Index = 9;
      break;
    case 0x20:
      FVar8.Index = 10;
      break;
    case 0x21:
    case 0x22:
      FVar8.Index = 0xb;
      break;
    default:
      if (style.Index != 0x159) goto switchD_0045cb11_caseD_1;
      FVar8.Index = 6;
    }
    th->RenderStyle = FVar8.Index;
    goto switchD_0045cb11_caseD_1;
  }
  UDMFParserBase::Flag<unsigned_int>
            (&this->super_UDMFParserBase,&th->flags,iVar6,
             *(char **)((long)&(FName::NameData.NameArray)->Text + lVar10));
  goto switchD_0045cb11_caseD_1;
LAB_0045cfa7:
  DVar7 = UDMFParserBase::CheckInt(&this->super_UDMFParserBase,FName::NameData.NameArray[0x23].Text)
  ;
  th->fillcolor = DVar7;
  goto switchD_0045cb11_caseD_1;
}

Assistant:

void ParseThing(FMapThing *th)
	{
		FString arg0str, arg1str;

		memset(th, 0, sizeof(*th));
		th->Gravity = 1;
		th->RenderStyle = STYLE_Count;
		th->Alpha = -1;
		th->health = 1;
		th->FloatbobPhase = -1;
		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Id:
				th->thingid = CheckInt(key);
				break;

			case NAME_X:
				th->pos.X = CheckFloat(key);
				break;

			case NAME_Y:
				th->pos.Y = CheckFloat(key);
				break;

			case NAME_Height:
				th->pos.Z = CheckFloat(key);
				break;

			case NAME_Angle:
				th->angle = (short)CheckInt(key);
				break;

			case NAME_Type:
				th->EdNum = (short)CheckInt(key);
				th->info = DoomEdMap.CheckKey(th->EdNum);
				break;

			case NAME_Conversation:
				CHECK_N(Zd | Zdt)
				th->Conversation = CheckInt(key);
				break;

			case NAME_Special:
				CHECK_N(Hx | Zd | Zdt | Va)
				th->special = CheckInt(key);
				break;

			case NAME_Gravity:
				CHECK_N(Zd | Zdt)
				th->Gravity = CheckFloat(key);
				break;

			case NAME_Arg0:
			case NAME_Arg1:
			case NAME_Arg2:
			case NAME_Arg3:
			case NAME_Arg4:
				CHECK_N(Hx | Zd | Zdt | Va)
				th->args[int(key)-int(NAME_Arg0)] = CheckInt(key);
				break;

			case NAME_Arg0Str:
				CHECK_N(Zd);
				arg0str = CheckString(key);
				break;

			case NAME_Arg1Str:
				CHECK_N(Zd);
				arg1str = CheckString(key);
				break;

			case NAME_Skill1:
			case NAME_Skill2:
			case NAME_Skill3:
			case NAME_Skill4:
			case NAME_Skill5:
			case NAME_Skill6:
			case NAME_Skill7:
			case NAME_Skill8:
			case NAME_Skill9:
			case NAME_Skill10:
			case NAME_Skill11:
			case NAME_Skill12:
			case NAME_Skill13:
			case NAME_Skill14:
			case NAME_Skill15:
			case NAME_Skill16:
				if (CheckBool(key)) th->SkillFilter |= (1<<(int(key)-NAME_Skill1));
				else th->SkillFilter &= ~(1<<(int(key)-NAME_Skill1));
				break;

			case NAME_Class1:
			case NAME_Class2:
			case NAME_Class3:
			case NAME_Class4:
			case NAME_Class5:
			case NAME_Class6:
			case NAME_Class7:
			case NAME_Class8:
			case NAME_Class9:
			case NAME_Class10:
			case NAME_Class11:
			case NAME_Class12:
			case NAME_Class13:
			case NAME_Class14:
			case NAME_Class15:
			case NAME_Class16:
				CHECK_N(Hx | Zd | Zdt | Va)
				if (CheckBool(key)) th->ClassFilter |= (1<<(int(key)-NAME_Class1));
				else th->ClassFilter &= ~(1<<(int(key)-NAME_Class1));
				break;

			case NAME_Ambush:
				Flag(th->flags, MTF_AMBUSH, key); 
				break;

			case NAME_Dormant:
				CHECK_N(Hx | Zd | Zdt | Va)
				Flag(th->flags, MTF_DORMANT, key); 
				break;

			case NAME_Single:
				Flag(th->flags, MTF_SINGLE, key); 
				break;

			case NAME_Coop:
				Flag(th->flags, MTF_COOPERATIVE, key); 
				break;

			case NAME_Dm:
				Flag(th->flags, MTF_DEATHMATCH, key); 
				break;

			case NAME_Translucent:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(th->flags, MTF_SHADOW, key); 
				break;

			case NAME_Invisible:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(th->flags, MTF_ALTSHADOW, key); 
				break;

			case NAME_Friend:	// This maps to Strife's friendly flag
				CHECK_N(Dm | Zd | Zdt | Va)
				Flag(th->flags, MTF_FRIENDLY, key); 
				break;

			case NAME_Strifeally:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(th->flags, MTF_FRIENDLY, key); 
				break;

			case NAME_Standing:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(th->flags, MTF_STANDSTILL, key); 
				break;

			case NAME_Countsecret:
				CHECK_N(Zd | Zdt | Va)
				Flag(th->flags, MTF_SECRET, key); 
				break;

			case NAME_Floatbobphase:
				CHECK_N(Zd | Zdt)
				th->FloatbobPhase = CheckInt(key);
				break;

			case NAME_Renderstyle:
				{
				FName style = CheckString(key);
				switch (style)
				{
				case NAME_None:
					th->RenderStyle = STYLE_None;
					break;
				case NAME_Normal:
					th->RenderStyle = STYLE_Normal;
					break;
				case NAME_Fuzzy:
					th->RenderStyle = STYLE_Fuzzy;
					break;
				case NAME_SoulTrans:
					th->RenderStyle = STYLE_SoulTrans;
					break;
				case NAME_OptFuzzy:
					th->RenderStyle = STYLE_OptFuzzy;
					break;
				case NAME_Stencil:
					th->RenderStyle = STYLE_Stencil;
					break;
				case NAME_AddStencil:
					th->RenderStyle = STYLE_AddStencil;
					break;
				case NAME_Translucent:
					th->RenderStyle = STYLE_Translucent;
					break;
				case NAME_Add:
				case NAME_Additive:
					th->RenderStyle = STYLE_Add;
					break;
				case NAME_Shaded:
					th->RenderStyle = STYLE_Shaded;
					break;
				case NAME_AddShaded:
					th->RenderStyle = STYLE_AddShaded;
					break;
				case NAME_TranslucentStencil:
					th->RenderStyle = STYLE_TranslucentStencil;
					break;
				case NAME_Shadow:
					th->RenderStyle = STYLE_Shadow;
					break;
				case NAME_Subtract:
				case NAME_Subtractive:
					th->RenderStyle = STYLE_Subtract;
					break;
				default:
					break;
				}
				}
				break;

			case NAME_Alpha:
				th->Alpha = CheckFloat(key);
				break;

			case NAME_FillColor:
				th->fillcolor = CheckInt(key);
				break;

			case NAME_Health:
				th->health = CheckInt(key);
				break;

			case NAME_Score:
				th->score = CheckInt(key);
				break;

			case NAME_Pitch:
				th->pitch = (short)CheckInt(key);
				break;

			case NAME_Roll:
				th->roll = (short)CheckInt(key);
				break;

			case NAME_ScaleX:
				th->Scale.X = CheckFloat(key);
				break;

			case NAME_ScaleY:
				th->Scale.Y = CheckFloat(key);
				break;

			case NAME_Scale:
				th->Scale.X = th->Scale.Y = CheckFloat(key);
				break;

			default:
				CHECK_N(Zd | Zdt)
				if (0 == strnicmp("user_", key.GetChars(), 5))
				{ // Custom user key - Sets an actor's user variable directly
					FMapThingUserData ud;
					ud.Property = key;
					ud.Value = CheckInt(key);
					MapThingsUserData.Push(ud);
				}
				break;
			}
		}
		if (arg0str.IsNotEmpty() && (P_IsACSSpecial(th->special) || th->special == 0))
		{
			th->args[0] = -FName(arg0str);
		}
		if (arg1str.IsNotEmpty() && (P_IsThingSpecial(th->special) || th->special == 0))
		{
			th->args[1] = -FName(arg1str);
		}
		// Thing specials are only valid in namespaces with Hexen-type specials
		// and in ZDoomTranslated - which will use the translator on them.
		if (namespc == NAME_ZDoomTranslated)
		{
			maplinedef_t mld;
			line_t ld;

			if (th->special != 0)	// if special is 0, keep the args (e.g. for bridge things)
			{
				// The trigger type is ignored here.
				mld.flags = 0;
				mld.special = th->special;
				mld.tag = th->args[0];
				P_TranslateLineDef(&ld, &mld);
				th->special = ld.special;
				memcpy(th->args, ld.args, sizeof (ld.args));
			}
		}
		else if (isTranslated)
		{
			th->special = 0;
			memset(th->args, 0, sizeof (th->args));
		}
	}